

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_expr.cc
# Opt level: O2

void __thiscall expr_concat_Test::~expr_concat_Test(expr_concat_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(expr, concat) {  // NOLINT
    Context c;
    auto mod = c.generator("mod");
    auto &var1 = mod.var("a", 1);
    auto &var2 = mod.var("b", 1);
    auto &var3 = var1.concat(var2);
    auto &var3_ = var3.concat(var2);
    EXPECT_EQ(var3_.to_string(), "{a, b, b}");

    // test raw constructor
    const auto &concat = VarConcat(var1.shared_from_this(), var2.shared_from_this());
    EXPECT_EQ(concat.to_string(), var3.to_string());
    EXPECT_EQ(concat.handle_name(true), "{a, b}");
    EXPECT_EQ(concat.handle_name(false), "{mod.a, mod.b}");
    EXPECT_EQ(concat.handle_name(&mod), "{a, b}");
}